

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtCylinderShape.cpp
# Opt level: O2

void __thiscall
cbtCylinderShape::calculateLocalInertia(cbtCylinderShape *this,cbtScalar mass,cbtVector3 *inertia)

{
  int iVar1;
  undefined1 auVar2 [16];
  float fVar3;
  float fVar4;
  undefined1 in_register_00001204 [60];
  undefined1 auVar6 [56];
  undefined1 auVar5 [64];
  float fVar7;
  float fVar8;
  undefined1 auVar9 [16];
  cbtVector3 cVar10;
  
  auVar6 = in_register_00001204._4_56_;
  cVar10 = getHalfExtentsWithMargin(this);
  auVar5._0_8_ = cVar10.m_floats._0_8_;
  auVar5._8_56_ = auVar6;
  iVar1 = *(int *)&(this->super_cbtConvexInternalShape).field_0x44;
  auVar9 = ZEXT416((uint)(mass / 12.0));
  fVar4 = mass * 0.25;
  fVar8 = mass * 0.5;
  fVar3 = cVar10.m_floats[0];
  if (iVar1 == 2) {
    fVar8 = fVar8 * fVar3 * fVar3;
    auVar9 = vfmadd231ss_fma(ZEXT416((uint)(fVar4 * fVar3 * fVar3)),auVar9,
                             ZEXT416((uint)(cVar10.m_floats[2] * cVar10.m_floats[2] * 4.0)));
    fVar4 = auVar9._0_4_;
    fVar3 = fVar4;
  }
  else {
    auVar2 = vmovshdup_avx(auVar5._0_16_);
    fVar7 = auVar2._0_4_;
    if (iVar1 == 0) {
      auVar9 = vfmadd231ss_fma(ZEXT416((uint)(fVar4 * fVar7 * fVar7)),auVar9,
                               ZEXT416((uint)(fVar3 * fVar3 * 4.0)));
      fVar4 = fVar8 * fVar7 * fVar7;
      fVar3 = auVar9._0_4_;
      fVar8 = auVar9._0_4_;
    }
    else {
      auVar9 = vfmadd231ss_fma(ZEXT416((uint)(fVar4 * fVar3 * fVar3)),auVar9,
                               ZEXT416((uint)(fVar7 * fVar7 * 4.0)));
      fVar4 = auVar9._0_4_;
      fVar3 = fVar8 * fVar3 * fVar3;
      fVar8 = fVar4;
    }
  }
  inertia->m_floats[0] = fVar4;
  inertia->m_floats[1] = fVar3;
  inertia->m_floats[2] = fVar8;
  inertia->m_floats[3] = 0.0;
  return;
}

Assistant:

void cbtCylinderShape::calculateLocalInertia(cbtScalar mass, cbtVector3& inertia) const
{
//Until Bullet 2.77 a box approximation was used, so uncomment this if you need backwards compatibility
//#define USE_BOX_INERTIA_APPROXIMATION 1
#ifndef USE_BOX_INERTIA_APPROXIMATION

	/*
	cylinder is defined as following:
	*
	* - principle axis aligned along y by default, radius in x, z-value not used
	* - for cbtCylinderShapeX: principle axis aligned along x, radius in y direction, z-value not used
	* - for cbtCylinderShapeZ: principle axis aligned along z, radius in x direction, y-value not used
	*
	*/

	cbtScalar radius2;                                    // square of cylinder radius
	cbtScalar height2;                                    // square of cylinder height
	cbtVector3 halfExtents = getHalfExtentsWithMargin();  // get cylinder dimension
	cbtScalar div12 = mass / 12.f;
	cbtScalar div4 = mass / 4.f;
	cbtScalar div2 = mass / 2.f;
	int idxRadius, idxHeight;

	switch (m_upAxis)  // get indices of radius and height of cylinder
	{
		case 0:  // cylinder is aligned along x
			idxRadius = 1;
			idxHeight = 0;
			break;
		case 2:  // cylinder is aligned along z
			idxRadius = 0;
			idxHeight = 2;
			break;
		default:  // cylinder is aligned along y
			idxRadius = 0;
			idxHeight = 1;
	}

	// calculate squares
	radius2 = halfExtents[idxRadius] * halfExtents[idxRadius];
	height2 = cbtScalar(4.) * halfExtents[idxHeight] * halfExtents[idxHeight];

	// calculate tensor terms
	cbtScalar t1 = div12 * height2 + div4 * radius2;
	cbtScalar t2 = div2 * radius2;

	switch (m_upAxis)  // set diagonal elements of inertia tensor
	{
		case 0:  // cylinder is aligned along x
			inertia.setValue(t2, t1, t1);
			break;
		case 2:  // cylinder is aligned along z
			inertia.setValue(t1, t1, t2);
			break;
		default:  // cylinder is aligned along y
			inertia.setValue(t1, t2, t1);
	}
#else   //USE_BOX_INERTIA_APPROXIMATION
	//approximation of box shape
	cbtVector3 halfExtents = getHalfExtentsWithMargin();

	cbtScalar lx = cbtScalar(2.) * (halfExtents.x());
	cbtScalar ly = cbtScalar(2.) * (halfExtents.y());
	cbtScalar lz = cbtScalar(2.) * (halfExtents.z());

	inertia.setValue(mass / (cbtScalar(12.0)) * (ly * ly + lz * lz),
					 mass / (cbtScalar(12.0)) * (lx * lx + lz * lz),
					 mass / (cbtScalar(12.0)) * (lx * lx + ly * ly));
#endif  //USE_BOX_INERTIA_APPROXIMATION
}